

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Id_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Id_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  size_t in_RDX;
  __sv_type _Var1;
  Boxed_Value BVar2;
  string_view t_name;
  exception *anon_var_0;
  char *local_30;
  atomic_uint_fast32_t *local_28;
  Dispatch_State *t_ss_local;
  Id_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  
  _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&t_ss->m_conversions);
  local_30 = (char *)_Var1._M_len;
  local_28 = (atomic_uint_fast32_t *)_Var1._M_str;
  t_name._M_str = local_30;
  t_name._M_len = in_RDX;
  BVar2 = chaiscript::detail::Dispatch_State::get_object((Dispatch_State *)this,t_name,local_28);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          return t_ss.get_object(this->text, m_loc);
        } catch (std::exception &) {
          throw exception::eval_error("Can not find object: " + this->text);
        }
      }